

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve.c
# Opt level: O1

void solvequeue(Item *q1,Item *q2,int blocktype,Item *qerr)

{
  int iVar1;
  Item *pIVar2;
  char *pcVar3;
  List *s;
  Item *pIVar4;
  
  if (solvq == (List *)0x0) {
    solvq = newlist();
  }
  if (blocktype == 0x130) {
    if (nrnstate == (List *)0x0) {
      nrnstate = newlist();
    }
    lappendstr(nrnstate,"{");
    if (qerr == (Item *)0x0) {
      pIVar4 = q1->prev;
      pIVar2 = q1;
      if (q2 != (Item *)0x0) {
        pIVar2 = q2;
      }
    }
    else {
      pIVar4 = q1->prev;
      pIVar2 = qerr;
    }
    movelist(pIVar4,pIVar2,nrnstate);
    lappendstr(nrnstate,"}");
  }
  if ((massage_list_ != (List *)0x0) && (pIVar4 = massage_list_->next, pIVar4 != massage_list_)) {
    do {
      pcVar3 = ((pIVar4->element).sym)->name;
      iVar1 = strcmp(pcVar3,((q1->element).sym)->name);
      if (iVar1 == 0) {
        diag("The SOLVE statement must be before the DERIVATIVE block for ",pcVar3);
      }
      pIVar4 = pIVar4->next;
    } while (pIVar4 != massage_list_);
  }
  pIVar2 = lappendsym(solvq,(Symbol *)0x0);
  (pIVar2->element).itm = q1;
  pIVar2->itemtype = (short)blocktype;
  pIVar4 = q1->next;
  if ((pIVar4->itemtype == 1) &&
     (iVar1 = strcmp("STEADYSTATE",((pIVar4->element).sym)->name), iVar1 == 0)) {
    pIVar2->itemtype = -(short)blocktype;
  }
  if (q2 == (Item *)0x0) {
    lappendsym(solvq,(Symbol *)0x0);
  }
  else {
    pIVar4 = q2->next;
    lappendsym(solvq,(q2->element).sym);
    iVar1 = strcmp(((q2->element).sym)->name,"derivimplicit");
    if (iVar1 == 0) {
      add_deriv_imp_list(((q1->element).sym)->name);
      add_deriv_imp_really(((q1->element).sym)->name);
    }
    pcVar3 = ((q2->element).sym)->name;
    iVar1 = strcmp(pcVar3,"cnexp");
    if (iVar1 == 0) {
      pcVar3 = stralloc("derivimplicit",pcVar3);
      ((q2->element).sym)->name = pcVar3;
      add_deriv_imp_list(((q1->element).sym)->name);
      cvode_cnexp_solve = pIVar2;
    }
    iVar1 = strcmp(((q2->element).sym)->name,"euler");
    if (iVar1 == 0) {
      add_deriv_imp_really(((q1->element).sym)->name);
    }
    delete(q2->prev);
    delete(q2);
  }
  delete(q1->prev);
  if (qerr == (Item *)0x0) {
    pcVar3 = current_line();
    sprintf(buf,"if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",pcVar3
           );
    qerr = insertstr(pIVar4,buf);
    pIVar4 = qerr;
  }
  else {
    replacstr(pIVar4,"if (error)");
  }
  s = newlist();
  pIVar2 = lappendsym(solvq,(Symbol *)0x0);
  (pIVar2->element).lst = s;
  movelist(pIVar4,qerr,s);
  return;
}

Assistant:

void solvequeue(q1, q2, blocktype, qerr) /*solve NAME=q1 [using METHOD=q2]*/
				/* q2 = 0 means method wasn't there */
				/* qerr in ITEM0 or else the closing
				   brace of an IFERROR stmt */
	Item *q1, *q2, *qerr;
	int blocktype;
{
	/* the solvq list is organized in groups of an item element
	followed by the method symbol( null if default to be used) */
	/* The itemtype field of the first is used to carry the blocktype*/
	/* SOLVE and METHOD method are deleted */
	/* The list now consists of triples in which the third element
	   is a list containing the complete IFERROR statement.
	*/
	Item *lq, *qtemp;
	List *errstmt;

	if (!solvq) {
		solvq = newlist();
	}
#if NMODL
	/* if the blocktype is equation then move the solve statement to
		the nrnstate function.  Everything else stays in the
		model function to be used as the nrncurrent function */
	if (blocktype == BREAKPOINT) {
		if (!nrnstate) {
			nrnstate = newlist();
		}
		Lappendstr(nrnstate, "{");
		if (qerr) {
			movelist(q1->prev, qerr, nrnstate);
		}else if (q2) {
			movelist(q1->prev, q2, nrnstate);
		}else{
			movelist(q1->prev, q1, nrnstate);
		}
		Lappendstr(nrnstate, "}");
	}
	/* verify that the block defintion for this SOLVE has not yet been seen */
	if (massage_list_) ITERATE(lq, massage_list_) {
		if (strcmp(SYM(lq)->name, SYM(q1)->name) == 0) {
diag("The SOLVE statement must be before the DERIVATIVE block for ", SYM(lq)->name);
		}
	}
#endif
	lq = lappendsym(solvq, SYM0);
	ITM(lq) = q1;
	lq->itemtype = blocktype;
	/* handle STEADYSTATE option */
	if (q1->next->itemtype == SYMBOL &&
	    strcmp("STEADYSTATE", SYM(q1->next)->name) == 0) {
		lq->itemtype = -blocktype; /* gets put back below */
	}
	if (q2) {
		qtemp = q2->next;	/* The IFERROR location */
		Lappendsym(solvq, SYM(q2));
		if (strcmp(SYM(q2)->name, "derivimplicit") == 0) {
			add_deriv_imp_list(SYM(q1)->name);
			add_deriv_imp_really(SYM(q1)->name);
		}
		if (strcmp(SYM(q2)->name, "cnexp") == 0) {
			SYM(q2)->name = stralloc("derivimplicit", SYM(q2)->name);
			add_deriv_imp_list(SYM(q1)->name);
#if CVODE
			cvode_cnexp_solve = lq;
#endif
		}
        // state functions for euler should be non-staic
        // deriv_imp_really list is used to track those functions
		if (strcmp(SYM(q2)->name, "euler") == 0) {
			add_deriv_imp_really(SYM(q1)->name);
		}
		delete(q2->prev);
		delete(q2);
	}else{
		qtemp = q1->next;
		Lappendsym(solvq, SYM0);
	}
	delete(q1->prev);

	/* handle the error statement */
	/* put one in if it isn't already there */
	if (qerr == ITEM0) {
#if NOCMODL
sprintf(buf, "if(error){fprintf(stderr,\"%s\\n\"); nrn_complain(_p); abort_run(error);}\n",
current_line());
		qtemp = qerr = insertstr(qtemp, buf);
#else
		qtemp = qerr = insertstr(qtemp,
"if(error){abort_run(error);}\n");
#endif
	}else{
		replacstr(qtemp, "if (error)");
	}
	errstmt = newlist();
	lq = lappendsym(solvq, SYM0);
	LST(lq) = errstmt;
	movelist(qtemp, qerr, errstmt);		
}